

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QAbstractSlider::timerEvent(QAbstractSlider *this,QTimerEvent *e)

{
  int iVar1;
  long lVar2;
  int iVar3;
  QStyle *pQVar4;
  int iVar5;
  SliderAction action;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(int *)(e + 0x10) != *(int *)(lVar2 + 0x284)) {
    return;
  }
  if ((long)*(int *)(lVar2 + 0x288) != 0) {
    QBasicTimer::start(lVar2 + 0x284,(long)*(int *)(lVar2 + 0x288) * 1000000,1,this);
    *(undefined4 *)(lVar2 + 0x288) = 0;
  }
  action = *(SliderAction *)(lVar2 + 0x28c);
  if (action == SliderPageStepSub) {
    iVar1 = *(int *)(lVar2 + 0x25c);
    iVar5 = *(int *)(lVar2 + 0x260);
    this = *(QAbstractSlider **)(lVar2 + 8);
    pQVar4 = QWidget::style(&this->super_QWidget);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x1b,0,this,0);
    if (iVar3 != 0) {
      iVar5 = iVar5 - iVar1;
LAB_003c26a6:
      iVar1 = *(int *)(lVar2 + 0x25c);
      iVar3 = *(int *)(lVar2 + 0x268);
      if (((iVar3 - iVar1) - iVar1 < iVar5) && (iVar5 < iVar3 + iVar1 * 2)) {
        *(undefined4 *)(lVar2 + 0x28c) = 0;
        setSliderPosition(this,iVar3);
        return;
      }
    }
  }
  else {
    if (action != SliderPageStepAdd) goto LAB_003c26e9;
    iVar1 = *(int *)(lVar2 + 0x25c);
    iVar5 = *(int *)(lVar2 + 0x260);
    this = *(QAbstractSlider **)(lVar2 + 8);
    pQVar4 = QWidget::style(&this->super_QWidget);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x1b,0,this,0);
    if (iVar3 != 0) {
      iVar5 = iVar5 + iVar1;
      goto LAB_003c26a6;
    }
  }
  action = *(SliderAction *)(lVar2 + 0x28c);
LAB_003c26e9:
  triggerAction(this,action);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }